

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

uint64 DiffFileTimes(LPFILETIME ft1,LPFILETIME ft2)

{
  ULONGLONG result;
  ULARGE_INTEGER ul2;
  ULARGE_INTEGER ul1;
  LPFILETIME ft2_local;
  LPFILETIME ft1_local;
  
  return (long)*ft1 - (long)*ft2;
}

Assistant:

uint64 DiffFileTimes(LPFILETIME ft1, LPFILETIME ft2)
{
    ULARGE_INTEGER ul1;
    ULARGE_INTEGER ul2;
    ul1.HighPart = ft1->dwHighDateTime;
    ul1.LowPart = ft1->dwLowDateTime;
    ul2.HighPart = ft2->dwHighDateTime;
    ul2.LowPart = ft2->dwLowDateTime;
    ULONGLONG result = ul1.QuadPart - ul2.QuadPart;
    return result;
}